

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase33::run(TestCase33 *this)

{
  word *pwVar1;
  size_t sVar2;
  ArrayPtr<capnp::word> AVar3;
  size_t local_230;
  uint local_228;
  bool local_221;
  word *pwStack_220;
  bool _kj_shouldLog_5;
  bool local_211;
  undefined1 auStack_210 [7];
  bool _kj_shouldLog_4;
  size_t sStack_208;
  size_t local_200;
  uint local_1f8;
  bool local_1f1;
  word *pwStack_1f0;
  bool _kj_shouldLog_3;
  bool local_1e1;
  undefined1 auStack_1e0 [7];
  bool _kj_shouldLog_2;
  size_t sStack_1d8;
  size_t local_1d0;
  uint local_1c8;
  bool local_1c1;
  word *pwStack_1c0;
  bool _kj_shouldLog_1;
  bool local_1b5;
  bool _kj_shouldLog;
  undefined1 auStack_1a8 [8];
  ArrayPtr<capnp::word> segment;
  undefined1 local_188 [8];
  MallocMessageBuilder builder;
  word scratch [16];
  TestCase33 *this_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)0x0;
  join_0x00000010_0x00000000_ =
       kj::arrayPtr<capnp::word>((word *)&builder.moreSegments.builder.disposer,0x10);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_188,join_0x00000010_0x00000000_,FIXED_SIZE);
  AVar3 = MallocMessageBuilder::allocateSegment((MallocMessageBuilder *)local_188,1);
  segment.ptr = (word *)AVar3.size_;
  auStack_1a8 = (undefined1  [8])AVar3.ptr;
  pwVar1 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)auStack_1a8);
  if ((word *)&builder.moreSegments.builder.disposer != pwVar1) {
    local_1b5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b5 != false) {
      pwStack_1c0 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)auStack_1a8);
      kj::_::Debug::log<char_const(&)[48],capnp::word(&)[16],capnp::word*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x27,ERROR,
                 "\"failed: expected \" \"(scratch) == (segment.begin())\", scratch, segment.begin()"
                 ,(char (*) [48])"failed: expected (scratch) == (segment.begin())",
                 (word (*) [16])&builder.moreSegments.builder.disposer,&stack0xfffffffffffffe40);
      local_1b5 = false;
    }
  }
  sVar2 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)auStack_1a8);
  if (sVar2 != 0x10) {
    local_1c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      local_1c8 = 0x10;
      local_1d0 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)auStack_1a8);
      kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x28,ERROR,
                 "\"failed: expected \" \"(16u) == (segment.size())\", 16u, segment.size()",
                 (char (*) [43])"failed: expected (16u) == (segment.size())",&local_1c8,&local_1d0);
      local_1c1 = false;
    }
  }
  _auStack_1e0 = MallocMessageBuilder::allocateSegment((MallocMessageBuilder *)local_188,1);
  segment.ptr = (word *)auStack_1e0._8_8_;
  auStack_1a8 = (undefined1  [8])auStack_1e0._0_8_;
  pwVar1 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)auStack_1a8);
  if ((word *)&builder.moreSegments.builder.disposer == pwVar1) {
    local_1e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e1 != false) {
      pwStack_1f0 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)auStack_1a8);
      kj::_::Debug::log<char_const(&)[48],capnp::word(&)[16],capnp::word*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x2b,ERROR,
                 "\"failed: expected \" \"(scratch) != (segment.begin())\", scratch, segment.begin()"
                 ,(char (*) [48])"failed: expected (scratch) != (segment.begin())",
                 (word (*) [16])&builder.moreSegments.builder.disposer,&stack0xfffffffffffffe10);
      local_1e1 = false;
    }
  }
  sVar2 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)auStack_1a8);
  if (sVar2 != 0x10) {
    local_1f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f1 != false) {
      local_1f8 = 0x10;
      local_200 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)auStack_1a8);
      kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x2c,ERROR,
                 "\"failed: expected \" \"(16u) == (segment.size())\", 16u, segment.size()",
                 (char (*) [43])"failed: expected (16u) == (segment.size())",&local_1f8,&local_200);
      local_1f1 = false;
    }
  }
  _auStack_210 = MallocMessageBuilder::allocateSegment((MallocMessageBuilder *)local_188,1);
  segment.ptr = (word *)auStack_210._8_8_;
  auStack_1a8 = (undefined1  [8])auStack_210._0_8_;
  pwVar1 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)auStack_1a8);
  if ((word *)&builder.moreSegments.builder.disposer == pwVar1) {
    local_211 = kj::_::Debug::shouldLog(ERROR);
    while (local_211 != false) {
      pwStack_220 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)auStack_1a8);
      kj::_::Debug::log<char_const(&)[48],capnp::word(&)[16],capnp::word*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x2f,ERROR,
                 "\"failed: expected \" \"(scratch) != (segment.begin())\", scratch, segment.begin()"
                 ,(char (*) [48])"failed: expected (scratch) != (segment.begin())",
                 (word (*) [16])&builder.moreSegments.builder.disposer,&stack0xfffffffffffffde0);
      local_211 = false;
    }
  }
  sVar2 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)auStack_1a8);
  if (sVar2 != 0x10) {
    local_221 = kj::_::Debug::shouldLog(ERROR);
    while (local_221 != false) {
      local_228 = 0x10;
      local_230 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)auStack_1a8);
      kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x30,ERROR,
                 "\"failed: expected \" \"(16u) == (segment.size())\", 16u, segment.size()",
                 (char (*) [43])"failed: expected (16u) == (segment.size())",&local_228,&local_230);
      local_221 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_188);
  return;
}

Assistant:

TEST(Endian, Byte) {
  byte bytes[] = {123, 45, 67, 89};

  WireValue<uint8_t>* vals = reinterpret_cast<WireValue<uint8_t>*>(bytes);

  EXPECT_EQ(123, vals[0].get());
  EXPECT_EQ(45, vals[1].get());
  EXPECT_EQ(67, vals[2].get());
  EXPECT_EQ(89, vals[3].get());

  vals[0].set(21);
  vals[1].set(43);
  vals[2].set(65);
  vals[3].set(87);

  EXPECT_EQ(21, bytes[0]);
  EXPECT_EQ(43, bytes[1]);
  EXPECT_EQ(65, bytes[2]);
  EXPECT_EQ(87, bytes[3]);
}